

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

ostream * despot::operator<<(ostream *os,vector<despot::State,_std::allocator<despot::State>_> *vec)

{
  ostream *os_00;
  int i;
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(vec->super__Vector_base<despot::State,_std::allocator<despot::State>_>)
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->super__Vector_base<despot::State,_std::allocator<despot::State>_>)
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    pcVar2 = ", ";
    if (lVar3 == 0) {
      pcVar2 = "";
    }
    os_00 = std::operator<<(os,pcVar2);
    operator<<(os_00,(State *)((long)&((vec->
                                       super__Vector_base<despot::State,_std::allocator<despot::State>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_vptr_State +
                              lVar3));
    lVar3 = lVar3 + 0x20;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}